

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O2

void __thiscall
Diligent::
DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
::DeviceObjectBase(DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                   *this,IReferenceCounters *pRefCounters,RenderDeviceGLImpl *pDevice,
                  PipelineResourceSignatureDesc *ObjDesc,bool bIsDeviceInternal)

{
  atomic<int> *paVar1;
  PipelineResourceDesc *pPVar2;
  ImmutableSamplerDesc *pIVar3;
  Char *pCVar4;
  Uint32 UVar5;
  undefined4 uVar6;
  Uint32 UVar7;
  Uint8 UVar8;
  Bool BVar9;
  undefined2 uVar10;
  int iVar11;
  size_t sVar12;
  IMemoryAllocator *pIVar13;
  char *pcVar14;
  undefined4 extraout_var_00;
  PipelineResourceSignatureDesc *Args_1;
  RenderDeviceGLImpl *this_00;
  string msg;
  undefined4 extraout_var;
  
  Args_1 = ObjDesc;
  ObjectBase<Diligent::IPipelineResourceSignature>::ObjectBase
            (&this->super_ObjectBase<Diligent::IPipelineResourceSignature>,pRefCounters);
  (this->super_ObjectBase<Diligent::IPipelineResourceSignature>).
  super_RefCountedObject<Diligent::IPipelineResourceSignature>.super_IPipelineResourceSignature.
  super_IDeviceObject.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_00a563c8;
  this->m_pDevice = pDevice;
  pPVar2 = ObjDesc->Resources;
  UVar5 = ObjDesc->NumResources;
  uVar6 = *(undefined4 *)&ObjDesc->field_0x14;
  pIVar3 = ObjDesc->ImmutableSamplers;
  UVar7 = ObjDesc->NumImmutableSamplers;
  UVar8 = ObjDesc->BindingIndex;
  BVar9 = ObjDesc->UseCombinedTextureSamplers;
  uVar10 = *(undefined2 *)&ObjDesc->field_0x26;
  pCVar4 = ObjDesc->CombinedSamplerSuffix;
  (this->m_Desc).super_DeviceObjectAttribs.Name = (ObjDesc->super_DeviceObjectAttribs).Name;
  (this->m_Desc).Resources = pPVar2;
  (this->m_Desc).NumResources = UVar5;
  *(undefined4 *)&(this->m_Desc).field_0x14 = uVar6;
  (this->m_Desc).ImmutableSamplers = pIVar3;
  (this->m_Desc).NumImmutableSamplers = UVar7;
  (this->m_Desc).BindingIndex = UVar8;
  (this->m_Desc).UseCombinedTextureSamplers = BVar9;
  *(undefined2 *)&(this->m_Desc).field_0x26 = uVar10;
  (this->m_Desc).CombinedSamplerSuffix = pCVar4;
  uVar6 = *(undefined4 *)&ObjDesc->field_0x34;
  (this->m_Desc).SRBAllocationGranularity = ObjDesc->SRBAllocationGranularity;
  *(undefined4 *)&(this->m_Desc).field_0x34 = uVar6;
  if (pDevice == (RenderDeviceGLImpl *)0x0) {
    iVar11 = 0;
  }
  else {
    LOCK();
    paVar1 = &(pDevice->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_UniqueId;
    iVar11 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    iVar11 = iVar11 + 1;
  }
  this->m_UniqueID = iVar11;
  this->m_bIsDeviceInternal = bIsDeviceInternal;
  (this->m_pUserData).m_pObject = (IObject *)0x0;
  if (!bIsDeviceInternal) {
    this_00 = this->m_pDevice;
    if (this_00 == (RenderDeviceGLImpl *)0x0) {
      FormatString<char[26],char[21]>
                (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pDevice != nullptr"
                 ,(char (*) [21])Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DeviceObjectBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                 ,0x47);
      std::__cxx11::string::~string((string *)&msg);
      this_00 = this->m_pDevice;
    }
    RefCountedObject<Diligent::IRenderDeviceGL>::AddRef
              ((RefCountedObject<Diligent::IRenderDeviceGL> *)this_00);
  }
  pcVar14 = (ObjDesc->super_DeviceObjectAttribs).Name;
  if (pcVar14 == (char *)0x0) {
    pIVar13 = GetStringAllocator();
    iVar11 = (**pIVar13->_vptr_IMemoryAllocator)
                       (pIVar13,0x13,"Object address string",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                        ,0x55);
    pcVar14 = (char *)CONCAT44(extraout_var_00,iVar11);
    snprintf(pcVar14,0x13,"0x%llX",this);
  }
  else {
    sVar12 = strlen(pcVar14);
    pIVar13 = GetStringAllocator();
    iVar11 = (**pIVar13->_vptr_IMemoryAllocator)
                       (pIVar13,sVar12 + 1,"Object name copy",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                        ,0x4e);
    pcVar14 = (char *)CONCAT44(extraout_var,iVar11);
    memcpy(pcVar14,(ObjDesc->super_DeviceObjectAttribs).Name,sVar12 + 1);
  }
  (this->m_Desc).super_DeviceObjectAttribs.Name = pcVar14;
  return;
}

Assistant:

DeviceObjectBase(IReferenceCounters*   pRefCounters,
                     RenderDeviceImplType* pDevice,
                     const ObjectDescType& ObjDesc,
                     bool                  bIsDeviceInternal = false) :
        // clang-format off
        TBase              {pRefCounters},
        m_pDevice          {pDevice          },
        m_Desc             {ObjDesc          },
        m_UniqueID         {pDevice != nullptr ? pDevice->GenerateUniqueId() : 0},
        m_bIsDeviceInternal{bIsDeviceInternal}
    //clang-format on
    {
        // Do not keep strong reference to the device if the object is an internal device object
        if (!m_bIsDeviceInternal)
        {
            // Device can be null if object is used for serialization
            VERIFY_EXPR(m_pDevice != nullptr);
            m_pDevice->AddRef();
        }

        if (ObjDesc.Name != nullptr)
        {
            size_t  size     = strlen(ObjDesc.Name) + 1;
            char* NameCopy = ALLOCATE(GetStringAllocator(), "Object name copy", char, size);
            memcpy(NameCopy, ObjDesc.Name, size);
            m_Desc.Name = NameCopy;
        }
        else
        {
            size_t size       = 16 + 2 + 1; // 0x12345678
            char*  AddressStr = ALLOCATE(GetStringAllocator(), "Object address string", char, size);
            snprintf(AddressStr, size, "0x%llX", static_cast<unsigned long long>(reinterpret_cast<size_t>(this)));
            m_Desc.Name = AddressStr;
        }

        //                        !!!WARNING!!!
        // We cannot add resource to the hash table from here, because the object
        // has not been completely created yet and the reference counters object
        // is not initialized!
        //m_pDevice->AddResourceToHash( this ); - ERROR!
    }